

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcsFile.cpp
# Opt level: O0

bool __thiscall mcsFile::VerifySector(mcsFile *this,uchar *data,unsigned_long len)

{
  ostream *poVar1;
  void *this_00;
  bool local_41;
  unsigned_long local_40;
  uint local_2c;
  int local_28;
  uint i;
  int num;
  uint lim;
  unsigned_long len_local;
  uchar *data_local;
  mcsFile *this_local;
  
  local_40 = len;
  if (0xffff < len) {
    local_40 = 0x10000;
  }
  local_28 = 0;
  for (local_2c = 0; local_2c < (uint)local_40; local_2c = local_2c + 1) {
    if (this->curSector[local_2c] != data[local_2c]) {
      poVar1 = (ostream *)std::ostream::operator<<(&std::cout,std::hex);
      poVar1 = std::operator<<(poVar1,"Mismatch at address ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->startAddr + (ulong)local_2c);
      poVar1 = std::operator<<(poVar1,", file = ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)this->curSector[local_2c]);
      poVar1 = std::operator<<(poVar1,", prom = ");
      this_00 = (void *)std::ostream::operator<<(poVar1,(uint)data[local_2c]);
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      local_28 = local_28 + 1;
      if (9 < local_28) break;
    }
  }
  local_41 = local_2c == (uint)local_40 && local_28 == 0;
  return local_41;
}

Assistant:

bool mcsFile::VerifySector(const unsigned char *data, unsigned long len) const
{
    unsigned int lim = (len < sizeof(curSector)) ? len : sizeof(curSector);
    int num = 0;  // number of mismatches
    unsigned int i;
    for (i = 0; i < lim; i++) {
        if (curSector[i] != data[i]) {
            std::cout << std::hex << "Mismatch at address " << startAddr+i
                      << ", file = " << (unsigned int)curSector[i]
                      << ", prom = " << (unsigned int)data[i] << std::endl;
            if (++num >= 10)
                break;
        }
    }
    return (i == lim) && (num == 0);
}